

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O3

bool __thiscall
ElfRelocator::relocateFile(ElfRelocator *this,ElfRelocatorFile *file,int64_t *relocationAddress)

{
  string *str;
  Elf32_Word EVar1;
  ElfFile *this_00;
  ElfSection *pEVar2;
  IElfRelocator *pIVar3;
  pointer pEVar4;
  element_type *peVar5;
  bool bVar6;
  long *plVar7;
  undefined8 uVar8;
  pointer pbVar9;
  uint uVar10;
  byte bVar11;
  int iVar12;
  ulong *puVar13;
  char *__s;
  mapped_type *pmVar14;
  byte bVar15;
  pointer args;
  long lVar16;
  string *error;
  size_t pos;
  long *plVar17;
  pointer pEVar18;
  pointer pEVar19;
  pointer pEVar20;
  uint uVar21;
  ElfRelocatorSection *entry;
  long lVar22;
  long lVar23;
  byte bVar24;
  ulong uVar25;
  long lVar26;
  ElfRelocator *pEVar27;
  byte *pbVar28;
  uint uVar29;
  pointer pEVar30;
  ElfRelocator *pEVar31;
  string_view text;
  string_view text_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  int symNum;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  Elf32_Sym sym;
  ByteArray sectionData;
  Elf32_Rela rela;
  shared_ptr<Label> label;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> relocationOffsets;
  bool local_1cc;
  undefined1 local_1b8 [40];
  ElfRelocator *local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  pointer local_170;
  int local_168;
  undefined4 local_164;
  int local_154;
  Elf32_Word local_150;
  uint local_14c;
  undefined1 local_148 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  ElfRelocatorFile *local_108;
  size_t local_100;
  ElfSection *local_f8;
  Elf32_Sym local_f0;
  undefined1 local_e0 [32];
  uint local_c0;
  undefined4 local_bc;
  string local_b8;
  pointer local_98;
  pointer local_90;
  SymbolTable *local_88;
  pointer local_80;
  pointer local_78;
  undefined1 local_70 [16];
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_60;
  
  this_00 = file->elf;
  pEVar27 = (ElfRelocator *)*relocationAddress;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pEVar18 = (file->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar30 = (file->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pEVar31 = pEVar27;
  local_108 = file;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pEVar18 != pEVar30) {
    local_190 = pEVar27;
    do {
      pEVar2 = pEVar18->section;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar18->index;
      if ((pEVar2->header).sh_type == 8) {
        uVar21 = (pEVar2->header).sh_addr;
        puVar13 = (ulong *)std::
                           map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                           ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                         *)&local_60,(key_type *)&local_188);
        *puVar13 = (ulong)uVar21;
      }
      else {
        EVar1 = (pEVar2->header).sh_size;
        uVar25 = (ulong)(pEVar2->header).sh_addralign;
        lVar22 = *relocationAddress;
        if (lVar22 % (long)uVar25 != 0) {
          do {
            lVar22 = lVar22 + 1;
          } while (lVar22 % (long)uVar25 != 0);
          *relocationAddress = lVar22;
        }
        peVar5 = (pEVar18->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar5 != (element_type *)0x0) {
          peVar5->value = lVar22;
          lVar22 = *relocationAddress;
        }
        pmVar14 = std::
                  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                  operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&local_60,(key_type *)&local_188);
        *pmVar14 = lVar22;
        *relocationAddress = *relocationAddress + (long)(int)EVar1;
      }
      pEVar18 = pEVar18 + 1;
    } while (pEVar18 != pEVar30);
    pEVar27 = (ElfRelocator *)*relocationAddress;
    pEVar31 = local_190;
  }
  local_100 = (this->outputData).size_;
  ByteArray::reserveBytes(&this->outputData,(long)pEVar27 - (long)pEVar31,'\0');
  pEVar18 = (local_108->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar30 = (local_108->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pEVar18 == pEVar30) {
    local_1cc = true;
  }
  else {
    local_98 = (pointer)&local_108->name;
    local_100 = local_100 - (long)pEVar31;
    bVar11 = 0;
    local_88 = &Global.symbolTable;
    local_90 = pEVar30;
    do {
      if ((pEVar18->section->header).sh_type != 8) {
        local_190 = (ElfRelocator *)pEVar18->index;
        pEVar27 = (ElfRelocator *)local_e0;
        ByteArray::ByteArray((ByteArray *)pEVar27,&pEVar18->section->data);
        pEVar2 = pEVar18->relSection;
        if (pEVar2 != (ElfSection *)0x0) {
          local_150 = (pEVar2->header).sh_type;
          args = (pointer)(ulong)CONCAT31((int3)(local_150 >> 8),local_150 == 4);
          local_148._0_8_ = (long *)0x0;
          local_148._8_8_ = (long *)0x0;
          local_148._16_8_ = 0;
          local_80 = pEVar18;
          if ((pEVar2->header).sh_size != 0) {
            local_154 = (uint)(local_150 == 4) * 4 + 8;
            local_78 = (pointer)&pEVar2->data;
            uVar21 = 0;
            local_f8 = pEVar2;
            do {
              args = local_78;
              loadRelocation(pEVar27,(Elf32_Rela *)(local_e0 + 0x1c),local_150 == 4,
                             (ByteArray *)local_78,uVar21,
                             (uint)((this_00->fileHeader).e_ident[5] != '\x02'));
              uVar10 = local_c0;
              pos = (size_t)(int)local_e0._28_4_;
              pEVar27 = (ElfRelocator *)
                        (this->relocator)._M_t.
                        super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>
                        .super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
              uVar29 = local_c0 & 0xff;
              iVar12 = (**(code **)((long)(pEVar27->outputData).data_ + 0x18))
                                 (pEVar27,(ulong)uVar29);
              if ((char)iVar12 == '\0') {
                local_14c = uVar10 >> 8;
                if (uVar10 < 0x100) {
                  bVar11 = 1;
                  pEVar27 = (ElfRelocator *)0x0;
                  Logger::queueError<int>((Logger *)0x0,0x190be6,(char *)&local_14c,(int *)args);
                }
                else {
                  ElfFile::getSymbol(this_00,&local_f0,(ulong)local_14c);
                  pbVar28 = (byte *)(ulong)local_f0.st_shndx;
                  iVar12 = ByteArray::getDoubleWord
                                     ((ByteArray *)local_e0,pos,
                                      (uint)((this_00->fileHeader).e_ident[5] != '\x02'));
                  local_188.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(local_188.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         iVar12);
                  local_1b8._0_8_ = local_190;
                  pmVar14 = std::
                            map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                            ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                          *)&local_60,(key_type *)local_1b8);
                  local_188.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pos + *pmVar14);
                  local_188.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(local_bc,local_188.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_);
                  pIVar3 = (this->relocator)._M_t.
                           super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>
                           .super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
                  args = (pointer)(ulong)(local_f0.st_info & 0xf);
                  (*pIVar3->_vptr_IElfRelocator[6])(pIVar3,&local_188,(ulong)local_f0.st_value);
                  if (local_f0.st_shndx == 0) {
                    if ((ulong)local_f0.st_name == 0) {
                      bVar11 = 1;
                      pEVar27 = (ElfRelocator *)0x1;
                      Logger::queueError<>(Error,"Symbol without a name");
                      goto LAB_00173a4d;
                    }
                    __s = ElfFile::getStrTableString(this_00,(ulong)local_f0.st_name);
                    str = (string *)(local_148 + 0x20);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)str,__s,(allocator<char> *)local_70);
                    toLowercase((string *)local_1b8,str);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._32_8_ != &local_118) {
                      operator_delete((void *)local_148._32_8_,local_118._M_allocated_capacity + 1);
                    }
                    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b8,local_1b8._0_8_,
                               (pointer)((long)&(((_Vector_impl *)
                                                 &((ByteArray *)local_1b8._8_8_)->data_)->
                                                super__Vector_impl_data)._M_start + local_1b8._0_8_)
                              );
                    Identifier::Identifier((Identifier *)str,&local_b8);
                    args = (pointer)0xffffffff;
                    SymbolTable::getLabel
                              ((SymbolTable *)local_70,(Identifier *)local_88,(int)str,-1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._32_8_ != &local_118) {
                      operator_delete((void *)local_148._32_8_,local_118._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                      operator_delete(local_b8._M_dataplus._M_p,
                                      (ulong)(local_b8.field_2._M_allocated_capacity + 1));
                    }
                    if (local_70._0_8_ == 0) {
                      Logger::queueError<std::__cxx11::string>
                                ((Logger *)0x1,0x190c14,local_1b8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)args);
LAB_00173c30:
                      bVar11 = 1;
                      bVar6 = false;
                    }
                    else {
                      if (*(char *)(local_70._0_8_ + 0x51) == '\0') {
                        args = local_98;
                        Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                                  (Error,"Undefined external symbol %s in file %s",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_98);
                        goto LAB_00173c30;
                      }
                      local_188.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(ulong)*(uint *)(local_70._0_8_ + 0x40);
                      args = (pointer)(ulong)*(byte *)(local_70._0_8_ + 0x52);
                      local_168 = 2 - (uint)*(byte *)(local_70._0_8_ + 0x52);
                      local_164 = *(undefined4 *)(local_70._0_8_ + 0x54);
                      bVar6 = true;
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
                    }
                    pEVar27 = (ElfRelocator *)local_1b8._0_8_;
                    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
                      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
                    }
                    if (!bVar6) goto LAB_00173a4d;
                  }
                  else {
                    local_1b8._0_8_ = pbVar28;
                    pmVar14 = std::
                              map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                            *)&local_60,(key_type *)local_1b8);
                    local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)((long)&(local_170->symbolName)._name._M_dataplus._M_p + *pmVar14)
                    ;
                  }
                  local_1b8._0_8_ = (ElfRelocator *)0x0;
                  local_1b8._8_8_ = (ElfRelocator *)0x0;
                  local_1b8._16_8_ = 0;
                  pIVar3 = (this->relocator)._M_t.
                           super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>
                           .super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
                  args = (pointer)local_148;
                  iVar12 = (*pIVar3->_vptr_IElfRelocator[4])
                                     (pIVar3,(ulong)uVar29,&local_188,args,local_1b8);
                  uVar8 = local_1b8._8_8_;
                  if ((char)iVar12 == '\0') {
                    bVar11 = 1;
                    for (pEVar27 = (ElfRelocator *)local_1b8._0_8_; pEVar27 != (ElfRelocator *)uVar8
                        ; pEVar27 = (ElfRelocator *)&pEVar27->files) {
                      text._M_str = (char *)args;
                      text._M_len = (size_t)(((_Vector_impl *)&(pEVar27->outputData).data_)->
                                            super__Vector_impl_data)._M_start;
                      Logger::queueError((Logger *)0x1,
                                         (ErrorType)(pointer)(pEVar27->outputData).size_,text);
                    }
                  }
                  pEVar27 = (ElfRelocator *)local_1b8;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pEVar27);
                }
              }
LAB_00173a4d:
              uVar21 = uVar21 + local_154;
            } while (uVar21 < (local_f8->header).sh_size);
          }
          local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pIVar3 = (this->relocator)._M_t.
                   super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>._M_t.
                   super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>.
                   super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
          iVar12 = (*pIVar3->_vptr_IElfRelocator[5])(pIVar3,local_148,&local_188);
          pbVar9 = local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          plVar17 = (long *)local_148._0_8_;
          plVar7 = (long *)local_148._8_8_;
          if ((char)iVar12 == '\0') {
            bVar11 = 1;
            for (pEVar19 = (pointer)local_188.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                plVar17 = (long *)local_148._0_8_, plVar7 = (long *)local_148._8_8_,
                pEVar19 != (pointer)pbVar9; pEVar19 = (pointer)&pEVar19->symbols) {
              text_00._M_str = (char *)args;
              text_00._M_len = (size_t)((_Alloc_hider *)&pEVar19->elf)->_M_p;
              Logger::queueError((Logger *)0x1,
                                 (ErrorType)
                                 *(size_type *)
                                  &(pEVar19->sections).
                                   super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>
                                   ._M_impl.super__Vector_impl_data,text_00);
            }
          }
          for (; plVar17 != plVar7; plVar17 = plVar17 + 2) {
            lVar22 = *plVar17;
            local_1b8._0_8_ = local_190;
            pmVar14 = std::
                      map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                      ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    *)&local_60,(key_type *)local_1b8);
            lVar22 = lVar22 - *pmVar14;
            if (lVar22 + 3U < (ulong)local_e0._8_8_) {
              uVar21 = *(uint *)(plVar17 + 1);
              bVar15 = (byte)(uVar21 >> 8);
              bVar24 = (byte)(uVar21 >> 0x10);
              if ((this_00->fileHeader).e_ident[5] == '\x02') {
                *(byte *)(local_e0._0_8_ + lVar22) = (byte)(uVar21 >> 0x18);
                *(byte *)(local_e0._0_8_ + lVar22 + 1) = bVar24;
                *(byte *)(local_e0._0_8_ + lVar22 + 2) = bVar15;
              }
              else {
                *(byte *)(local_e0._0_8_ + lVar22) = (byte)uVar21;
                *(byte *)(local_e0._0_8_ + lVar22 + 1) = bVar15;
                *(byte *)(local_e0._0_8_ + lVar22 + 2) = bVar24;
                uVar21 = uVar21 >> 0x18;
              }
              *(byte *)(local_e0._0_8_ + lVar22 + 3U) = (byte)uVar21;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_188);
          pEVar18 = local_80;
          pEVar30 = local_90;
          if ((long *)local_148._0_8_ != (long *)0x0) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
            pEVar18 = local_80;
            pEVar30 = local_90;
          }
        }
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_190;
        pmVar14 = std::
                  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                  operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&local_60,(key_type *)&local_188);
        memcpy((this->outputData).data_ + *pmVar14 + local_100,(void *)local_e0._0_8_,local_e0._8_8_
              );
        ByteArray::~ByteArray((ByteArray *)local_e0);
      }
      pEVar18 = pEVar18 + 1;
    } while (pEVar18 != pEVar30);
    local_1cc = (bool)(bVar11 ^ 1);
  }
  pEVar20 = (local_108->symbols).
            super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar4 = (local_108->symbols).
           super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar20 != pEVar4) {
    do {
      lVar22 = pEVar20->relocatedAddress;
      pEVar27 = (ElfRelocator *)pEVar20->section;
      if (pEVar27 == (ElfRelocator *)0xfff2) {
        lVar23 = *relocationAddress;
        lVar16 = lVar23 % pEVar20->relativeAddress;
        lVar26 = lVar23;
        while (lVar16 != 0) {
          lVar26 = lVar26 + 1;
          *relocationAddress = lVar26;
          lVar16 = lVar26 % pEVar20->relativeAddress;
        }
        pEVar20->relocatedAddress = lVar26;
        lVar26 = *relocationAddress + pEVar20->size;
        *relocationAddress = lVar26;
        ByteArray::reserveBytes(&this->outputData,lVar26 - lVar23,'\0');
        lVar23 = pEVar20->relocatedAddress;
      }
      else if (pEVar27 == (ElfRelocator *)0xfff1) {
        lVar23 = pEVar20->relativeAddress;
        pEVar20->relocatedAddress = lVar23;
      }
      else {
        lVar23 = pEVar20->relativeAddress;
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar27;
        pmVar14 = std::
                  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                  operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&local_60,(key_type *)&local_188);
        lVar23 = lVar23 + *pmVar14;
        pEVar20->relocatedAddress = lVar23;
      }
      peVar5 = (pEVar20->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar5 != (element_type *)0x0) {
        peVar5->value = lVar23;
      }
      if (lVar22 != lVar23) {
        this->dataChanged = true;
      }
      pEVar20 = pEVar20 + 1;
    } while (pEVar20 != pEVar4);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~_Rb_tree(&local_60);
  return local_1cc;
}

Assistant:

bool ElfRelocator::relocateFile(ElfRelocatorFile& file, int64_t& relocationAddress)
{
	ElfFile* elf = file.elf;
	int64_t start = relocationAddress;

	// calculate address for each section
	std::map<int64_t,int64_t> relocationOffsets;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;
		int size = section->getSize();

		if (section->getType() == SHT_NOBITS) 
		{
			// these sections should not be relocated...
			relocationOffsets[index] = section->getAddress();

		} else {
			while (relocationAddress % section->getAlignment())
				relocationAddress++;

			if (entry.label != nullptr)
				entry.label->setValue(relocationAddress);

			relocationOffsets[index] = relocationAddress;
			relocationAddress += size;
		}
	}

	size_t dataStart = outputData.size();
	outputData.reserveBytes((size_t)(relocationAddress-start));

	// load sections
	bool error = false;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;

		if (section->getType() == SHT_NOBITS)
		{
			// reserveBytes initialized the data to 0 already
			continue;
		}
		
		ByteArray sectionData = section->getData();

		// relocate if necessary
		ElfSection* relSection = entry.relSection;
		if (relSection != nullptr)
		{
			bool isRela = relSection->getType() == SHT_RELA;
			int structSize = isRela ? sizeof(Elf32_Rela) : sizeof(Elf32_Rel);

			std::vector<RelocationAction> relocationActions;
			for (unsigned int relOffset = 0; relOffset < relSection->getSize(); relOffset += structSize)
			{
				Elf32_Rela rela;
				loadRelocation(rela, isRela, relSection->getData(), relOffset, elf->getEndianness());
				int pos = rela.r_offset;

				if (relocator->isDummyRelocationType(rela.getType()))
					continue;

				int symNum = rela.getSymbolNum();
				if (symNum <= 0)
				{
					Logger::queueError(Logger::Warning, "Invalid symbol num %06X",symNum);
					error = true;
					continue;
				}

				Elf32_Sym sym;
				elf->getSymbol(sym, symNum);
				int symSection = sym.st_shndx;
				
				RelocationData relData;
				relData.opcode = sectionData.getDoubleWord(pos, elf->getEndianness());
				relData.opcodeOffset = pos+relocationOffsets[index];
				relData.addend = rela.r_addend;
				relocator->setSymbolAddress(relData,sym.st_value,sym.st_info & 0xF);

				// externs?
				if (sym.st_shndx == 0)
				{
					if (sym.st_name == 0)
					{
						Logger::queueError(Logger::Error, "Symbol without a name");
						error = true;
						continue;
					}

					std::string symName = toLowercase(elf->getStrTableString(sym.st_name));

					std::shared_ptr<Label> label = Global.symbolTable.getLabel(Identifier(symName),-1,-1);
					if (label == nullptr)
					{
						Logger::queueError(Logger::Error, "Invalid external symbol %s",symName);
						error = true;
						continue;
					}
					if (!label->isDefined())
					{
						Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",symName,file.name);
						error = true;
						continue;
					}
					
					relData.relocationBase = (unsigned int) label->getValue();
					relData.targetSymbolType = label->isData() ? STT_OBJECT : STT_FUNC;
					relData.targetSymbolInfo = label->getInfo();
				} else {
					relData.relocationBase = relocationOffsets[symSection]+relData.symbolAddress;
				}

				std::vector<std::string> errors;
				if (!relocator->relocateOpcode(rela.getType(), relData, relocationActions, errors))
				{
					for (const std::string& error : errors)
					{
						Logger::queueError(Logger::Error, error);
					}
					error = true;
					continue;
				}
			}

			// finish any dangling relocations
			std::vector<std::string> errors;
			if (!relocator->finish(relocationActions, errors))
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}

			// now actually write the relocated values
			for (const RelocationAction& action : relocationActions)
			{
				sectionData.replaceDoubleWord(action.offset-relocationOffsets[index], action.newValue, elf->getEndianness());
			}
		}

		size_t arrayStart = (size_t) (dataStart+relocationOffsets[index]-start);
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}
	
	// now update symbols
	for (ElfRelocatorSymbol& sym: file.symbols)
	{
		int64_t oldAddress = sym.relocatedAddress;

		switch (sym.section)
		{
		case SHN_ABS:		// address does not change
			sym.relocatedAddress = sym.relativeAddress;
			break;
		case SHN_COMMON:	// needs to be allocated. relativeAddress gives alignment constraint
			{
				int64_t start = relocationAddress;

				while (relocationAddress % sym.relativeAddress)
					relocationAddress++;

				sym.relocatedAddress = relocationAddress;
				relocationAddress += sym.size;
				outputData.reserveBytes((size_t)(relocationAddress-start));
			}
			break;
		default:			// normal relocated symbol
			sym.relocatedAddress = sym.relativeAddress+relocationOffsets[sym.section];
			break;
		}

		if (sym.label != nullptr)
			sym.label->setValue(sym.relocatedAddress);

		if (oldAddress != sym.relocatedAddress)
			dataChanged = true;
	}

	return !error;
}